

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

void Dau_DsdTest555(void)

{
  word *pwVar1;
  word *pwVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  word *pwVar7;
  char *pcVar8;
  int w;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  timespec ts_1;
  char pBuffer [2000];
  word Tru [2] [64];
  char pRes [2000];
  uint local_13fc;
  timespec local_13f8;
  long local_13e8;
  undefined8 local_13e0;
  timespec local_13d8 [125];
  word awStack_c08 [64];
  word local_a08 [64];
  char local_808 [2008];
  
  __stream = fopen("_npn/npn/dsd10.txt","rb");
  iVar3 = clock_gettime(3,local_13d8);
  if (iVar3 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_13d8[0].tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) +
            CONCAT71(local_13d8[0].tv_sec._1_7_,(char)local_13d8[0].tv_sec) * -1000000;
  }
  pcVar5 = fgets((char *)local_13d8,2000,__stream);
  if (pcVar5 == (char *)0x0) {
    dVar13 = 0.0;
    uVar10 = 0;
  }
  else {
    pcVar5 = (char *)0x0;
    local_13fc = 0;
    local_13e8 = lVar9;
    local_13e0 = __stream;
    do {
      sVar6 = strlen((char *)local_13d8);
      if (*(char *)((long)&local_13e0 + sVar6 + 7) == '\n') {
        *(undefined1 *)((long)&local_13e0 + sVar6 + 7) = 0;
        lVar9 = (long)&local_13e0 + 6;
      }
      else {
        lVar9 = (long)&local_13e0 + 7;
      }
      if (*(char *)(lVar9 + sVar6) == '\r') {
        *(char *)(lVar9 + sVar6) = '\0';
      }
      if (((char)local_13d8[0].tv_sec != '\0') && ((char)local_13d8[0].tv_sec != 'V')) {
        pwVar7 = Dau_DsdToTruth((char *)((long)&local_13d8[0].tv_sec +
                                        (ulong)((char)local_13d8[0].tv_sec == '*')),10);
        lVar9 = 0;
        do {
          awStack_c08[lVar9] = pwVar7[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x10);
        lVar9 = 0;
        do {
          local_a08[lVar9] = pwVar7[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x10);
        iVar3 = clock_gettime(3,&local_13f8);
        if (iVar3 < 0) {
          lVar9 = 1;
        }
        else {
          lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_13f8.tv_nsec),8);
          lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_13f8.tv_sec * -1000000;
        }
        iVar3 = Dau_DsdDecompose(local_a08,10,0,1,local_808);
        iVar4 = clock_gettime(3,&local_13f8);
        if (iVar4 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_13f8.tv_nsec / 1000 + local_13f8.tv_sec * 1000000;
        }
        Dau_DsdNormalize(pcVar5);
        if (iVar3 != 0) {
          __assert_fail("nSizeNonDec == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0x814,"void Dau_DsdTest555()");
        }
        local_13fc = local_13fc + 1;
        pcVar5 = pcVar5 + lVar11 + lVar9;
        pwVar7 = Dau_DsdToTruth(local_808,10);
        __stream = local_13e0;
        lVar9 = 0;
        do {
          pwVar1 = pwVar7 + lVar9;
          pwVar2 = awStack_c08 + lVar9;
          if (*pwVar1 != *pwVar2) break;
          bVar12 = lVar9 != 0xf;
          lVar9 = lVar9 + 1;
        } while (bVar12);
        if (*pwVar1 != *pwVar2) {
          printf("%s -> %s \n",local_13d8,local_808);
          puts("Verification failed.");
        }
      }
      pcVar8 = fgets((char *)local_13d8,2000,__stream);
    } while (pcVar8 != (char *)0x0);
    dVar13 = (double)(long)pcVar5;
    uVar10 = (ulong)local_13fc;
    lVar9 = local_13e8;
  }
  iVar3 = 0x8873c7;
  printf("Finished trying %d decompositions.  ",uVar10);
  Abc_Print(iVar3,"%s =","Time");
  Abc_Print(iVar3,"%9.2f sec\n",dVar13 / 1000000.0);
  iVar4 = 3;
  iVar3 = clock_gettime(3,&local_13f8);
  if (iVar3 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_13f8.tv_nsec / 1000 + local_13f8.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Total");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar11 + lVar9) / 1000000.0);
  dVar13 = (double)s_Times_0;
  Abc_Print(iVar4,"%s =","Time1");
  Abc_Print(iVar4,"%9.2f sec\n",dVar13 / 1000000.0);
  dVar13 = (double)s_Times_1;
  Abc_Print(iVar4,"%s =","Time2");
  Abc_Print(iVar4,"%9.2f sec\n",dVar13 / 1000000.0);
  dVar13 = (double)s_Times_2;
  Abc_Print(iVar4,"%s =","Time3");
  Abc_Print(iVar4,"%9.2f sec\n",dVar13 / 1000000.0);
  fclose(__stream);
  return;
}

Assistant:

void Dau_DsdTest555()
{
    int nVars = 10;
    int nWords = Abc_TtWordNum(nVars);
    char * pFileName = "_npn/npn/dsd10.txt";
    FILE * pFile = fopen( pFileName, "rb" );
    word Tru[2][DAU_MAX_WORD], * pTruth;
    char pBuffer[DAU_MAX_STR];
    char pRes[DAU_MAX_STR];
    int nSizeNonDec;
    int i, Counter = 0;
    abctime clk = Abc_Clock(), clkDec = 0, clk2;
//    return;

    while ( fgets( pBuffer, DAU_MAX_STR, pFile ) != NULL )
    {
        char * pStr2 = pBuffer + strlen(pBuffer)-1;
        if ( *pStr2 == '\n' )
            *pStr2-- = 0;
        if ( *pStr2 == '\r' )
            *pStr2-- = 0;
        if ( pBuffer[0] == 'V' || pBuffer[0] == 0 )
            continue;
        Counter++; 

        for ( i = 0; i < 1; i++ )
        {
//            Dau_DsdPermute( pBuffer );
            pTruth = Dau_DsdToTruth( pBuffer[0] == '*' ? pBuffer + 1 : pBuffer, nVars );
            Abc_TtCopy( Tru[0], pTruth, nWords, 0 );
            Abc_TtCopy( Tru[1], pTruth, nWords, 0 );
            clk2 = Abc_Clock();
            nSizeNonDec = Dau_DsdDecompose( Tru[1], nVars, 0, 1, pRes );
            clkDec += Abc_Clock() - clk2;
            Dau_DsdNormalize( pRes );
//            pStr2 = Dau_DsdPerform( t ); nSizeNonDec = 0;
            assert( nSizeNonDec == 0 );
            pTruth = Dau_DsdToTruth( pRes, nVars );
            if ( !Abc_TtEqual( pTruth, Tru[0], nWords ) )
            {
    //        Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );
    //        printf( "  " );
    //        Kit_DsdPrintFromTruth( (unsigned *)&t2, 6 );
                printf( "%s -> %s \n", pBuffer, pRes );
                printf( "Verification failed.\n" );
            }
        }
    }
    printf( "Finished trying %d decompositions.  ", Counter );
    Abc_PrintTime( 1, "Time", clkDec );
    Abc_PrintTime( 1, "Total", Abc_Clock() - clk );

    Abc_PrintTime( 1, "Time1", s_Times[0] );
    Abc_PrintTime( 1, "Time2", s_Times[1] );
    Abc_PrintTime( 1, "Time3", s_Times[2] );

    fclose( pFile );
}